

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::BitwiseShiftLeftOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,int,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,int right,ValidityMask *mask,idx_t idx
                   )

{
  idx_t iVar1;
  OutOfRangeException *this;
  bitstring_t bits;
  string_t target;
  anon_union_16_2_67f50693_for_value local_78;
  anon_union_16_2_67f50693_for_value local_68;
  undefined1 local_58 [24];
  string local_40;
  idx_t len;
  
  local_68.pointer.ptr = (char *)local_68._0_8_;
  bits.value._8_8_ = left.value._8_8_;
  local_78._0_8_ = left.value._0_8_;
  bits.value._0_8_ = bits.value._8_8_;
  local_78.pointer.ptr = bits.value._8_8_;
  iVar1 = Bit::BitLength((Bit *)local_78._0_8_,bits);
  if (right == 0) {
    local_68.pointer.ptr = local_78.pointer.ptr;
    local_68._0_8_ = local_78._0_8_;
  }
  else {
    if (right < 0) {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_68._0_8_ = local_58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Cannot left-shift by negative number %s","");
      NumericHelper::ToString<int>(&local_40,right);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string>
                (this,(string *)&local_68.pointer,&local_40);
      __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_68.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString
                   ((StringVector *)fun.result,(Vector *)(local_78._0_8_ & 0xffffffff),len);
    if (right < (int)iVar1) {
      Bit::LeftShift((bitstring_t *)&local_78.pointer,(ulong)(uint)right,
                     (bitstring_t *)&local_68.pointer);
    }
    else {
      Bit::SetEmptyBitString((bitstring_t *)&local_68.pointer,(string_t *)&local_78.pointer);
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_68.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}